

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
* duckdb::ParquetWriteSelect
            (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *__return_storage_ptr__,CopyToSelectInput *input)

{
  LogicalTypeId LVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long *plVar3;
  bool bVar4;
  _Alloc_hider _Var5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  pointer pEVar10;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *pvVar11;
  LogicalType *pLVar12;
  LogicalType *pLVar13;
  idx_t iVar14;
  uint uVar15;
  anon_class_1_0_00000001 *func;
  uint *func_00;
  LogicalType *extraout_RDX;
  LogicalType *extraout_RDX_00;
  LogicalType *type;
  LogicalType *extraout_RDX_01;
  LogicalType *extraout_RDX_02;
  LogicalType *type_00;
  LogicalType *type_01;
  LogicalType *type_02;
  LogicalType *extraout_RDX_03;
  LogicalType *extraout_RDX_04;
  LogicalType *type_03;
  LogicalType *type_04;
  LogicalType *type_05;
  LogicalType *type_06;
  LogicalType *extraout_RDX_05;
  LogicalType *extraout_RDX_06;
  LogicalType *type_07;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *pvVar16;
  pointer this;
  TypeVisitor *pTVar17;
  element_type *peVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> cast_expr;
  LogicalType wkb_blob_type;
  LogicalType new_type;
  undefined1 local_170 [8];
  undefined8 local_168;
  _Alloc_hider _Stack_160;
  undefined1 local_158 [24];
  LogicalType local_140;
  LogicalType local_128;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_110;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_108;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_100;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_f8;
  pointer local_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  LogicalType local_d0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_b8;
  CopyToSelectInput *local_a0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_98;
  pointer local_90;
  LogicalType local_88;
  string local_70;
  string local_50;
  
  local_f8._M_head_impl = (BoundCastData *)input->context;
  local_b8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (input->select_list).
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (input->select_list).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pvVar16 = __return_storage_ptr__;
  local_a0 = input;
  if (this != local_90) {
    bVar8 = false;
    local_98 = __return_storage_ptr__;
    do {
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this);
      local_f0 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this);
      pLVar12 = &pEVar10->return_type;
      if (((local_a0->copy_to_type == COPY_TO_FILE) && (pLVar12->id_ == BLOB)) &&
         (bVar7 = LogicalType::HasAlias(pLVar12), bVar7)) {
        LogicalType::GetAlias_abi_cxx11_(&local_50,pLVar12);
        iVar9 = ::std::__cxx11::string::compare((char *)&local_50);
        bVar4 = true;
        bVar7 = true;
        if (iVar9 != 0) goto LAB_01b6ab93;
        bVar7 = GeoParquetFileMetadata::IsGeoParquetConversionEnabled
                          ((ClientContext *)local_f8._M_head_impl);
      }
      else {
        bVar7 = false;
LAB_01b6ab93:
        bVar4 = bVar7;
        bVar7 = false;
      }
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      local_f0 = (pointer)&(local_f0->super_BaseExpression).alias;
      if (bVar7 != false) {
        LogicalType::LogicalType((LogicalType *)local_158,BLOB);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"WKB_BLOB","");
        LogicalType::SetAlias((LogicalType *)local_158,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        local_100._M_head_impl =
             (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)local_170,(ClientContext *)local_f8._M_head_impl,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_100,(LogicalType *)local_158,false);
        if (local_100._M_head_impl != (Expression *)0x0) {
          (*((local_100._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_100._M_head_impl = (Expression *)0x0;
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_170);
        ::std::__cxx11::string::_M_assign((string *)&(pEVar10->super_BaseExpression).alias);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_b8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_170);
        plVar3 = (long *)CONCAT62(local_170._2_6_,CONCAT11(local_170[1],local_170[0]));
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 8))();
        }
        pLVar12 = (LogicalType *)local_158;
        goto LAB_01b6b6d8;
      }
      if ((local_a0->copy_to_type != EXPORT_DATABASE) ||
         (bVar7 = TypeVisitor::Contains<bool(&)(duckdb::LogicalType_const&)>(pLVar12,IsTypeLossy),
         !bVar7)) {
        bVar7 = TypeVisitor::Contains<bool(&)(duckdb::LogicalType_const&)>
                          (pLVar12,IsTypeNotSupported);
        if (!bVar7) {
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&local_b8,this);
          goto LAB_01b6b6df;
        }
        func_00 = &switchD_01b6ae38::switchdataD_01e5e9f4;
        switch(pLVar12->id_) {
        case STRUCT:
          pvVar11 = &StructType::GetChildTypes_abi_cxx11_(pLVar12)->
                     super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ;
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)local_158,pvVar11);
          uVar6 = local_158._8_8_;
          if (local_158._0_8_ != local_158._8_8_) {
            pLVar12 = extraout_RDX_01;
            pTVar17 = (TypeVisitor *)(local_158._0_8_ + 0x20);
            do {
              TypeVisitor::
              VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                        ((LogicalType *)local_170,pTVar17,pLVar12,(anon_class_1_0_00000001 *)func_00
                        );
              _Var5._M_p = _Stack_160._M_p;
              peVar18 = local_168;
              *pTVar17 = local_170[0];
              pTVar17[1] = local_170[1];
              uVar19 = *(undefined4 *)(pTVar17 + 8);
              uVar21 = *(undefined4 *)(pTVar17 + 0x10);
              *(undefined8 *)(pTVar17 + 8) = 0;
              *(undefined8 *)(pTVar17 + 0x10) = 0;
              local_168 = (element_type *)0x0;
              _Stack_160._M_p = (pointer)0x0;
              p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar17 + 0x10);
              *(element_type **)(pTVar17 + 8) = peVar18;
              *(pointer *)(pTVar17 + 0x10) = _Var5._M_p;
              uVar20 = *(undefined4 *)(pTVar17 + 0xc);
              uVar22 = *(undefined4 *)(pTVar17 + 0x14);
              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_e8 = uVar19;
                uStack_e4 = *(undefined4 *)(pTVar17 + 0xc);
                uStack_e0 = uVar21;
                uStack_dc = *(undefined4 *)(pTVar17 + 0x14);
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
                uVar19 = local_e8;
                uVar20 = uStack_e4;
                uVar21 = uStack_e0;
                uVar22 = uStack_dc;
              }
              _Var5._M_p = _Stack_160._M_p;
              local_168 = (element_type *)CONCAT44(uVar20,uVar19);
              _Stack_160._M_p._4_4_ = uVar22;
              _Stack_160._M_p._0_4_ = uVar21;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
              }
              LogicalType::~LogicalType((LogicalType *)local_170);
              peVar18 = (element_type *)(pTVar17 + 0x18);
              pLVar12 = extraout_RDX_02;
              pTVar17 = pTVar17 + 0x38;
            } while (peVar18 != (element_type *)uVar6);
          }
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)&local_140,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)local_158);
          LogicalType::STRUCT((LogicalType *)local_170,(child_list_t<LogicalType> *)&local_140);
          if ((((byte)local_170[1] < 0x1e) &&
              ((0x21800000U >> ((byte)local_170[1] & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                ((LogicalType *)local_170,
                                 (optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar8)) {
            LogicalType::LogicalType(&local_128,(LogicalType *)local_170);
          }
          else {
            LogicalType::LogicalType(&local_128,VARCHAR);
          }
          break;
        case LIST:
          pLVar12 = ListType::GetChildType(pLVar12);
          LogicalType::LogicalType((LogicalType *)local_158,pLVar12);
          TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                    (&local_140,(TypeVisitor *)local_158,type_02,(anon_class_1_0_00000001 *)func_00)
          ;
          LogicalType::LIST((LogicalType *)local_170,&local_140);
          if ((((byte)local_170[1] < 0x1e) &&
              ((0x21800000U >> ((byte)local_170[1] & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                ((LogicalType *)local_170,
                                 (optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar8)) {
            LogicalType::LogicalType(&local_128,(LogicalType *)local_170);
          }
          else {
            LogicalType::LogicalType(&local_128,VARCHAR);
          }
          goto LAB_01b6b25b;
        case MAP:
          pLVar13 = MapType::KeyType(pLVar12);
          LogicalType::LogicalType((LogicalType *)local_158,pLVar13);
          pLVar12 = MapType::ValueType(pLVar12);
          LogicalType::LogicalType((LogicalType *)local_170,pLVar12);
          TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                    (&local_d0,(TypeVisitor *)local_158,type_00,(anon_class_1_0_00000001 *)func_00);
          TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                    (&local_88,(TypeVisitor *)local_170,type_01,(anon_class_1_0_00000001 *)func_00);
          LogicalType::MAP(&local_140,&local_d0,&local_88);
          if (((local_140.physical_type_ < 0x1e) &&
              ((0x21800000U >> (local_140.physical_type_ & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                (&local_140,(optional_ptr<duckdb_parquet::Type::type,_true>)0x0),
             bVar8)) {
            LogicalType::LogicalType(&local_128,&local_140);
          }
          else {
            LogicalType::LogicalType(&local_128,VARCHAR);
          }
          LogicalType::~LogicalType(&local_140);
          LogicalType::~LogicalType(&local_88);
          LogicalType::~LogicalType(&local_d0);
          pLVar12 = (LogicalType *)local_170;
          goto LAB_01b6b268;
        default:
          uVar15 = (uint)(pEVar10->return_type).physical_type_;
          if (((uVar15 < 0x1e) && ((0x21800000U >> (uVar15 & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                (pLVar12,(optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar8
             )) {
            LogicalType::LogicalType(&local_128,pLVar12);
          }
          else {
            LogicalType::LogicalType(&local_128,VARCHAR);
          }
          goto LAB_01b6b27a;
        case UNION:
          UnionType::CopyMemberTypes_abi_cxx11_
                    ((child_list_t<LogicalType> *)local_158,(UnionType *)pLVar12,type);
          uVar6 = local_158._8_8_;
          if (local_158._0_8_ != local_158._8_8_) {
            pLVar12 = extraout_RDX_03;
            pTVar17 = (TypeVisitor *)(local_158._0_8_ + 0x20);
            do {
              TypeVisitor::
              VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                        ((LogicalType *)local_170,pTVar17,pLVar12,(anon_class_1_0_00000001 *)func_00
                        );
              _Var5._M_p = _Stack_160._M_p;
              peVar18 = local_168;
              *pTVar17 = local_170[0];
              pTVar17[1] = local_170[1];
              uVar19 = *(undefined4 *)(pTVar17 + 8);
              uVar21 = *(undefined4 *)(pTVar17 + 0x10);
              *(undefined8 *)(pTVar17 + 8) = 0;
              *(undefined8 *)(pTVar17 + 0x10) = 0;
              local_168 = (element_type *)0x0;
              _Stack_160._M_p = (pointer)0x0;
              p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar17 + 0x10);
              *(element_type **)(pTVar17 + 8) = peVar18;
              *(pointer *)(pTVar17 + 0x10) = _Var5._M_p;
              uVar20 = *(undefined4 *)(pTVar17 + 0xc);
              uVar22 = *(undefined4 *)(pTVar17 + 0x14);
              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_e8 = uVar19;
                uStack_e4 = *(undefined4 *)(pTVar17 + 0xc);
                uStack_e0 = uVar21;
                uStack_dc = *(undefined4 *)(pTVar17 + 0x14);
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
                uVar19 = local_e8;
                uVar20 = uStack_e4;
                uVar21 = uStack_e0;
                uVar22 = uStack_dc;
              }
              _Var5._M_p = _Stack_160._M_p;
              local_168 = (element_type *)CONCAT44(uVar20,uVar19);
              _Stack_160._M_p._4_4_ = uVar22;
              _Stack_160._M_p._0_4_ = uVar21;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
              }
              LogicalType::~LogicalType((LogicalType *)local_170);
              peVar18 = (element_type *)(pTVar17 + 0x18);
              pLVar12 = extraout_RDX_04;
              pTVar17 = pTVar17 + 0x38;
            } while (peVar18 != (element_type *)uVar6);
          }
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)&local_140,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)local_158);
          LogicalType::UNION((LogicalType *)local_170,(child_list_t<LogicalType> *)&local_140);
          if ((((byte)local_170[1] < 0x1e) &&
              ((0x21800000U >> ((byte)local_170[1] & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                ((LogicalType *)local_170,
                                 (optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar8)) {
            LogicalType::LogicalType(&local_128,(LogicalType *)local_170);
          }
          else {
            LogicalType::LogicalType(&local_128,VARCHAR);
          }
          break;
        case ARRAY:
          pLVar13 = ArrayType::GetChildType(pLVar12);
          LogicalType::LogicalType((LogicalType *)local_158,pLVar13);
          TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                    (&local_140,(TypeVisitor *)local_158,type_03,(anon_class_1_0_00000001 *)func_00)
          ;
          iVar14 = ArrayType::GetSize(pLVar12);
          optional_idx::optional_idx((optional_idx *)&local_d0,iVar14);
          LogicalType::ARRAY((LogicalType *)local_170,&local_140,(optional_idx)local_d0._0_8_);
          if ((((byte)local_170[1] < 0x1e) &&
              ((0x21800000U >> ((byte)local_170[1] & 0x1f) & 1) != 0)) ||
             (bVar8 = ParquetWriter::TryGetParquetType
                                ((LogicalType *)local_170,
                                 (optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar8)) {
            LogicalType::LogicalType(&local_128,(LogicalType *)local_170);
          }
          else {
            LogicalType::LogicalType(&local_128,VARCHAR);
          }
LAB_01b6b25b:
          LogicalType::~LogicalType((LogicalType *)local_170);
          pLVar12 = &local_140;
LAB_01b6b268:
          LogicalType::~LogicalType(pLVar12);
          LogicalType::~LogicalType((LogicalType *)local_158);
          goto LAB_01b6b27a;
        }
        LogicalType::~LogicalType((LogicalType *)local_170);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&local_140);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)local_158);
LAB_01b6b27a:
        local_110._M_head_impl =
             (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)local_158,(ClientContext *)local_f8._M_head_impl,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_110,&local_128,false);
        if (local_110._M_head_impl != (Expression *)0x0) {
          (*((local_110._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_110._M_head_impl = (Expression *)0x0;
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_158);
        ::std::__cxx11::string::_M_assign((string *)&(pEVar10->super_BaseExpression).alias);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_b8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_158);
        goto LAB_01b6b6c3;
      }
      LVar1 = pLVar12->id_;
      uVar15 = LVar1 - 100;
      if (8 < uVar15) {
switchD_01b6ad01_caseD_67:
        if ((byte)(LVar1 - UHUGEINT) < 2) {
          LogicalType::LogicalType(&local_128,VARCHAR);
        }
        else {
          LogicalType::LogicalType(&local_128,pLVar12);
        }
        goto LAB_01b6b64c;
      }
      func = (anon_class_1_0_00000001 *)
             ((long)&switchD_01b6ad01::switchdataD_01e5ea18 +
             (long)(int)(&switchD_01b6ad01::switchdataD_01e5ea18)[uVar15]);
      switch((uint)LVar1) {
      case 100:
        pvVar11 = &StructType::GetChildTypes_abi_cxx11_(pLVar12)->
                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ;
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)local_158,pvVar11);
        uVar6 = local_158._8_8_;
        if (local_158._0_8_ != local_158._8_8_) {
          pLVar12 = extraout_RDX;
          pTVar17 = (TypeVisitor *)(local_158._0_8_ + 0x20);
          do {
            TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                      ((LogicalType *)local_170,pTVar17,pLVar12,func);
            _Var5._M_p = _Stack_160._M_p;
            peVar18 = local_168;
            *pTVar17 = local_170[0];
            pTVar17[1] = local_170[1];
            uVar19 = *(undefined4 *)(pTVar17 + 8);
            uVar21 = *(undefined4 *)(pTVar17 + 0x10);
            *(undefined8 *)(pTVar17 + 8) = 0;
            *(undefined8 *)(pTVar17 + 0x10) = 0;
            local_168 = (element_type *)0x0;
            _Stack_160._M_p = (pointer)0x0;
            p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar17 + 0x10);
            *(element_type **)(pTVar17 + 8) = peVar18;
            *(pointer *)(pTVar17 + 0x10) = _Var5._M_p;
            uVar20 = *(undefined4 *)(pTVar17 + 0xc);
            uVar22 = *(undefined4 *)(pTVar17 + 0x14);
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_e8 = uVar19;
              uStack_e4 = *(undefined4 *)(pTVar17 + 0xc);
              uStack_e0 = uVar21;
              uStack_dc = *(undefined4 *)(pTVar17 + 0x14);
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
              uVar19 = local_e8;
              uVar20 = uStack_e4;
              uVar21 = uStack_e0;
              uVar22 = uStack_dc;
            }
            _Var5._M_p = _Stack_160._M_p;
            local_168 = (element_type *)CONCAT44(uVar20,uVar19);
            _Stack_160._M_p._4_4_ = uVar22;
            _Stack_160._M_p._0_4_ = uVar21;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
            }
            LogicalType::~LogicalType((LogicalType *)local_170);
            peVar18 = (element_type *)(pTVar17 + 0x18);
            pLVar12 = extraout_RDX_00;
            pTVar17 = pTVar17 + 0x38;
          } while (peVar18 != (element_type *)uVar6);
        }
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)&local_140,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)local_158);
        LogicalType::STRUCT((LogicalType *)local_170,(child_list_t<LogicalType> *)&local_140);
        if ((byte)((char)local_170[0] - 0x31U) < 2) {
          LogicalType::LogicalType(&local_128,VARCHAR);
        }
        else {
          LogicalType::LogicalType(&local_128,(LogicalType *)local_170);
        }
        break;
      case 0x65:
        pLVar12 = ListType::GetChildType(pLVar12);
        LogicalType::LogicalType((LogicalType *)local_158,pLVar12);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  (&local_140,(TypeVisitor *)local_158,type_06,func);
        LogicalType::LIST((LogicalType *)local_170,&local_140);
        if ((byte)((char)local_170[0] - 0x31U) < 2) {
          LogicalType::LogicalType(&local_128,VARCHAR);
        }
        else {
          LogicalType::LogicalType(&local_128,(LogicalType *)local_170);
        }
        goto LAB_01b6b5ab;
      case 0x66:
        pLVar13 = MapType::KeyType(pLVar12);
        LogicalType::LogicalType((LogicalType *)local_158,pLVar13);
        pLVar12 = MapType::ValueType(pLVar12);
        LogicalType::LogicalType((LogicalType *)local_170,pLVar12);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  (&local_d0,(TypeVisitor *)local_158,type_04,func);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  (&local_88,(TypeVisitor *)local_170,type_05,func);
        LogicalType::MAP(&local_140,&local_d0,&local_88);
        if ((byte)(local_140.id_ - UHUGEINT) < 2) {
          LogicalType::LogicalType(&local_128,VARCHAR);
        }
        else {
          LogicalType::LogicalType(&local_128,&local_140);
        }
        LogicalType::~LogicalType(&local_140);
        LogicalType::~LogicalType(&local_88);
        LogicalType::~LogicalType(&local_d0);
        pLVar12 = (LogicalType *)local_170;
        goto LAB_01b6b5f3;
      default:
        goto switchD_01b6ad01_caseD_67;
      case 0x6b:
        UnionType::CopyMemberTypes_abi_cxx11_
                  ((child_list_t<LogicalType> *)local_158,(UnionType *)pLVar12,
                   (LogicalType *)&switchD_01b6ad01::switchdataD_01e5ea18);
        uVar6 = local_158._8_8_;
        if (local_158._0_8_ != local_158._8_8_) {
          pLVar12 = extraout_RDX_05;
          pTVar17 = (TypeVisitor *)&(((BaseExpression *)local_158._0_8_)->alias).field_2;
          do {
            TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                      ((LogicalType *)local_170,pTVar17,pLVar12,func);
            _Var5._M_p = _Stack_160._M_p;
            peVar18 = local_168;
            *pTVar17 = local_170[0];
            pTVar17[1] = local_170[1];
            uVar19 = *(undefined4 *)(pTVar17 + 8);
            uVar21 = *(undefined4 *)(pTVar17 + 0x10);
            *(undefined8 *)(pTVar17 + 8) = 0;
            *(undefined8 *)(pTVar17 + 0x10) = 0;
            local_168 = (element_type *)0x0;
            _Stack_160._M_p = (pointer)0x0;
            p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar17 + 0x10);
            *(element_type **)(pTVar17 + 8) = peVar18;
            *(pointer *)(pTVar17 + 0x10) = _Var5._M_p;
            uVar20 = *(undefined4 *)(pTVar17 + 0xc);
            uVar22 = *(undefined4 *)(pTVar17 + 0x14);
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_e8 = uVar19;
              uStack_e4 = *(undefined4 *)(pTVar17 + 0xc);
              uStack_e0 = uVar21;
              uStack_dc = *(undefined4 *)(pTVar17 + 0x14);
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
              uVar19 = local_e8;
              uVar20 = uStack_e4;
              uVar21 = uStack_e0;
              uVar22 = uStack_dc;
            }
            _Var5._M_p = _Stack_160._M_p;
            local_168 = (element_type *)CONCAT44(uVar20,uVar19);
            _Stack_160._M_p._4_4_ = uVar22;
            _Stack_160._M_p._0_4_ = uVar21;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
            }
            LogicalType::~LogicalType((LogicalType *)local_170);
            peVar18 = (element_type *)(pTVar17 + 0x18);
            pLVar12 = extraout_RDX_06;
            pTVar17 = pTVar17 + 0x38;
          } while (peVar18 != (element_type *)uVar6);
        }
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)&local_140,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)local_158);
        LogicalType::UNION((LogicalType *)local_170,(child_list_t<LogicalType> *)&local_140);
        if ((byte)((char)local_170[0] - 0x31U) < 2) {
          LogicalType::LogicalType(&local_128,VARCHAR);
        }
        else {
          LogicalType::LogicalType(&local_128,(LogicalType *)local_170);
        }
        break;
      case 0x6c:
        pLVar13 = ArrayType::GetChildType(pLVar12);
        LogicalType::LogicalType((LogicalType *)local_158,pLVar13);
        TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                  (&local_140,(TypeVisitor *)local_158,type_07,func);
        iVar14 = ArrayType::GetSize(pLVar12);
        optional_idx::optional_idx((optional_idx *)&local_d0,iVar14);
        LogicalType::ARRAY((LogicalType *)local_170,&local_140,(optional_idx)local_d0._0_8_);
        if ((byte)((char)local_170[0] - 0x31U) < 2) {
          LogicalType::LogicalType(&local_128,VARCHAR);
        }
        else {
          LogicalType::LogicalType(&local_128,(LogicalType *)local_170);
        }
LAB_01b6b5ab:
        LogicalType::~LogicalType((LogicalType *)local_170);
        pLVar12 = &local_140;
LAB_01b6b5f3:
        LogicalType::~LogicalType(pLVar12);
        LogicalType::~LogicalType((LogicalType *)local_158);
        goto LAB_01b6b64c;
      }
      LogicalType::~LogicalType((LogicalType *)local_170);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_140);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)local_158);
LAB_01b6b64c:
      local_108._M_head_impl =
           (BaseStatistics *)
           (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_158,(ClientContext *)local_f8._M_head_impl,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_108,&local_128,false);
      if ((tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
          local_108._M_head_impl != (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) {
        (*((BaseExpression *)&(local_108._M_head_impl)->type)->_vptr_BaseExpression[1])();
      }
      local_108._M_head_impl = (BaseStatistics *)0x0;
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_158);
      ::std::__cxx11::string::_M_assign((string *)&(pEVar10->super_BaseExpression).alias);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_b8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_158);
LAB_01b6b6c3:
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_158._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_158._0_8_ + 8))();
      }
      pLVar12 = &local_128;
LAB_01b6b6d8:
      LogicalType::~LogicalType(pLVar12);
      bVar8 = true;
LAB_01b6b6df:
      this = this + 1;
    } while (this != local_90);
    __return_storage_ptr__ = local_98;
    pvVar16 = local_98;
    if (bVar8) {
      (local_98->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_b8.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (local_98->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_b8.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (local_98->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_b8.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __return_storage_ptr__ = &local_b8;
    }
  }
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_b8);
  return pvVar16;
}

Assistant:

static vector<unique_ptr<Expression>> ParquetWriteSelect(CopyToSelectInput &input) {

	auto &context = input.context;

	vector<unique_ptr<Expression>> result;

	bool any_change = false;

	for (auto &expr : input.select_list) {

		const auto &type = expr->return_type;
		const auto &name = expr->GetAlias();

		// Spatial types need to be encoded into WKB when writing GeoParquet.
		// But dont perform this conversion if this is a EXPORT DATABASE statement
		if (input.copy_to_type == CopyToType::COPY_TO_FILE && type.id() == LogicalTypeId::BLOB && type.HasAlias() &&
		    type.GetAlias() == "GEOMETRY" && GeoParquetFileMetadata::IsGeoParquetConversionEnabled(context)) {

			LogicalType wkb_blob_type(LogicalTypeId::BLOB);
			wkb_blob_type.SetAlias("WKB_BLOB");

			auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(expr), wkb_blob_type, false);
			cast_expr->SetAlias(name);
			result.push_back(std::move(cast_expr));
			any_change = true;
		}
		// If this is an EXPORT DATABASE statement, we dont want to write "lossy" types, instead cast them to VARCHAR
		else if (input.copy_to_type == CopyToType::EXPORT_DATABASE && TypeVisitor::Contains(type, IsTypeLossy)) {
			// Replace all lossy types with VARCHAR
			auto new_type = TypeVisitor::VisitReplace(
			    type, [](const LogicalType &ty) -> LogicalType { return IsTypeLossy(ty) ? LogicalType::VARCHAR : ty; });

			// Cast the column to the new type
			auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(expr), new_type, false);
			cast_expr->SetAlias(name);
			result.push_back(std::move(cast_expr));
			any_change = true;
		}
		// Else look if there is any unsupported type
		else if (TypeVisitor::Contains(type, IsTypeNotSupported)) {
			// If there is at least one unsupported type, replace all unsupported types with varchar
			// and perform a CAST
			auto new_type = TypeVisitor::VisitReplace(type, [](const LogicalType &ty) -> LogicalType {
				return IsTypeNotSupported(ty) ? LogicalType::VARCHAR : ty;
			});

			auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(expr), new_type, false);
			cast_expr->SetAlias(name);
			result.push_back(std::move(cast_expr));
			any_change = true;
		}
		// Otherwise, just reference the input column
		else {
			result.push_back(std::move(expr));
		}
	}

	// If any change was made, return the new expressions
	// otherwise, return an empty vector to indicate no change and avoid pushing another projection on to the plan
	if (any_change) {
		return result;
	}
	return {};
}